

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

bool __thiscall
cmDepends::Check(cmDepends *this,char *makeFile,char *internalFile,
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
                *validDeps)

{
  bool bVar1;
  uint uVar2;
  bool collapse;
  allocator local_2b1;
  string local_2b0;
  long local_290;
  ifstream fin;
  bool local_81;
  undefined1 local_80 [7];
  bool okay;
  allocator local_49;
  undefined1 local_48 [8];
  string oldcwd;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
  *validDeps_local;
  char *internalFile_local;
  char *makeFile_local;
  cmDepends *this_local;
  
  oldcwd.field_2._8_8_ = validDeps;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,".",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar1 = std::operator!=(&this->CompileDirectory,".");
  if (bVar1) {
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)local_80,(SystemTools *)0x0,collapse);
    std::__cxx11::string::operator=((string *)local_48,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    cmsys::SystemTools::ChangeDirectory(&this->CompileDirectory);
  }
  local_81 = true;
  std::ifstream::ifstream(&local_290,internalFile,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_290 + *(long *)(local_290 + -0x18)));
  if ((!bVar1) ||
     (uVar2 = (*this->_vptr_cmDepends[3])(this,&local_290,internalFile,oldcwd.field_2._8_8_),
     (uVar2 & 1) == 0)) {
    Clear(this,makeFile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2b0,internalFile,&local_2b1);
    cmsys::SystemTools::RemoveFile(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    local_81 = false;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,".");
  if (bVar1) {
    cmsys::SystemTools::ChangeDirectory((string *)local_48);
  }
  std::ifstream::~ifstream(&local_290);
  std::__cxx11::string::~string((string *)local_48);
  return local_81;
}

Assistant:

bool cmDepends::Check(const char *makeFile, const char *internalFile,
                      std::map<std::string, DependencyVector>& validDeps)
{
  // Dependency checks must be done in proper working directory.
  std::string oldcwd = ".";
  if(this->CompileDirectory != ".")
    {
    // Get the CWD but do not call CollapseFullPath because
    // we only need it to cd back, and the form does not matter
    oldcwd = cmSystemTools::GetCurrentWorkingDirectory(false);
    cmSystemTools::ChangeDirectory(this->CompileDirectory);
    }

  // Check whether dependencies must be regenerated.
  bool okay = true;
  cmsys::ifstream fin(internalFile);
  if(!(fin && this->CheckDependencies(fin, internalFile, validDeps)))
    {
    // Clear all dependencies so they will be regenerated.
    this->Clear(makeFile);
    cmSystemTools::RemoveFile(internalFile);
    okay = false;
    }

  // Restore working directory.
  if(oldcwd != ".")
    {
    cmSystemTools::ChangeDirectory(oldcwd);
    }

  return okay;
}